

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_ntlm.c
# Opt level: O3

CURLcode Curl_output_ntlm(connectdata *conn,_Bool proxy)

{
  curlntlm cVar1;
  CURLcode CVar2;
  char *passwdp;
  int iVar3;
  undefined7 in_register_00000031;
  char *pcVar4;
  ntlmdata *ntlm;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  char *base64;
  size_t len;
  char *local_48;
  Curl_easy *local_40;
  size_t local_38;
  
  iVar3 = (int)CONCAT71(in_register_00000031,proxy);
  local_48 = (char *)0x0;
  local_38 = 0;
  lVar5 = 0x368;
  if (iVar3 != 0) {
    lVar5 = 0x350;
  }
  local_40 = conn->data;
  uVar6 = (ulong)(uint)(iVar3 << 5);
  ntlm = (ntlmdata *)((conn->ntlm).nonce + (uVar6 - 8));
  pcVar4 = *(char **)(conn->local_ip + uVar6 + 0x38);
  passwdp = *(char **)(conn->local_ip + uVar6 + 0x40);
  (&(local_40->state).authhost.done)[uVar6] = false;
  pcVar7 = "";
  if (pcVar4 == (char *)0x0) {
    pcVar4 = "";
  }
  if (passwdp == (char *)0x0) {
    passwdp = "";
  }
  cVar1 = ntlm->state;
  if (cVar1 == NTLMSTATE_TYPE2) {
    CVar2 = Curl_auth_create_ntlm_type3_message(local_40,pcVar4,passwdp,ntlm,&local_48,&local_38);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    if (local_48 == (char *)0x0) {
      return CURLE_OK;
    }
    (*Curl_cfree)(*(void **)((conn->chunk).hexbuffer + lVar5 + -8));
    if (proxy) {
      pcVar7 = "Proxy-";
    }
    pcVar4 = curl_maprintf("%sAuthorization: NTLM %s\r\n",pcVar7,local_48);
    *(char **)((conn->chunk).hexbuffer + lVar5 + -8) = pcVar4;
    (*Curl_cfree)(local_48);
    if (*(long *)((conn->chunk).hexbuffer + lVar5 + -8) == 0) {
      return CURLE_OUT_OF_MEMORY;
    }
    ntlm->state = NTLMSTATE_TYPE3;
  }
  else {
    if (cVar1 == NTLMSTATE_TYPE3) {
      ntlm->state = NTLMSTATE_LAST;
    }
    else if (cVar1 != NTLMSTATE_LAST) {
      CVar2 = Curl_auth_create_ntlm_type1_message(pcVar4,passwdp,ntlm,&local_48,&local_38);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      if (local_48 == (char *)0x0) {
        return CURLE_OK;
      }
      (*Curl_cfree)(*(void **)((conn->chunk).hexbuffer + lVar5 + -8));
      if (proxy) {
        pcVar7 = "Proxy-";
      }
      pcVar4 = curl_maprintf("%sAuthorization: NTLM %s\r\n",pcVar7,local_48);
      *(char **)((conn->chunk).hexbuffer + lVar5 + -8) = pcVar4;
      (*Curl_cfree)(local_48);
      if (*(long *)((conn->chunk).hexbuffer + lVar5 + -8) != 0) {
        return CURLE_OK;
      }
      return CURLE_OUT_OF_MEMORY;
    }
    (*Curl_cfree)(*(void **)((conn->chunk).hexbuffer + lVar5 + -8));
    pcVar4 = (conn->chunk).hexbuffer + lVar5 + -8;
    pcVar4[0] = '\0';
    pcVar4[1] = '\0';
    pcVar4[2] = '\0';
    pcVar4[3] = '\0';
    pcVar4[4] = '\0';
    pcVar4[5] = '\0';
    pcVar4[6] = '\0';
    pcVar4[7] = '\0';
  }
  (&(local_40->state).authhost.done)[uVar6] = true;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_output_ntlm(struct connectdata *conn, bool proxy)
{
  char *base64 = NULL;
  size_t len = 0;
  CURLcode result;

  /* point to the address of the pointer that holds the string to send to the
     server, which is for a plain host or for a HTTP proxy */
  char **allocuserpwd;

  /* point to the name and password for this */
  const char *userp;
  const char *passwdp;

  /* point to the correct struct with this */
  struct ntlmdata *ntlm;
  struct auth *authp;

  DEBUGASSERT(conn);
  DEBUGASSERT(conn->data);

#ifdef USE_NSS
  if(CURLE_OK != Curl_nss_force_init(conn->data))
    return CURLE_OUT_OF_MEMORY;
#endif

  if(proxy) {
    allocuserpwd = &conn->allocptr.proxyuserpwd;
    userp = conn->proxyuser;
    passwdp = conn->proxypasswd;
    ntlm = &conn->proxyntlm;
    authp = &conn->data->state.authproxy;
  }
  else {
    allocuserpwd = &conn->allocptr.userpwd;
    userp = conn->user;
    passwdp = conn->passwd;
    ntlm = &conn->ntlm;
    authp = &conn->data->state.authhost;
  }
  authp->done = FALSE;

  /* not set means empty */
  if(!userp)
    userp = "";

  if(!passwdp)
    passwdp = "";

#ifdef USE_WINDOWS_SSPI
  if(s_hSecDll == NULL) {
    /* not thread safe and leaks - use curl_global_init() to avoid */
    CURLcode err = Curl_sspi_global_init();
    if(s_hSecDll == NULL)
      return err;
  }
#endif

  switch(ntlm->state) {
  case NTLMSTATE_TYPE1:
  default: /* for the weird cases we (re)start here */
    /* Create a type-1 message */
    result = Curl_auth_create_ntlm_type1_message(userp, passwdp, ntlm, &base64,
                                                 &len);
    if(result)
      return result;

    if(base64) {
      free(*allocuserpwd);
      *allocuserpwd = aprintf("%sAuthorization: NTLM %s\r\n",
                              proxy ? "Proxy-" : "",
                              base64);
      free(base64);
      if(!*allocuserpwd)
        return CURLE_OUT_OF_MEMORY;

      DEBUG_OUT(fprintf(stderr, "**** Header %s\n ", *allocuserpwd));
    }
    break;

  case NTLMSTATE_TYPE2:
    /* We already received the type-2 message, create a type-3 message */
    result = Curl_auth_create_ntlm_type3_message(conn->data, userp, passwdp,
                                                 ntlm, &base64, &len);
    if(result)
      return result;

    if(base64) {
      free(*allocuserpwd);
      *allocuserpwd = aprintf("%sAuthorization: NTLM %s\r\n",
                              proxy ? "Proxy-" : "",
                              base64);
      free(base64);
      if(!*allocuserpwd)
        return CURLE_OUT_OF_MEMORY;

      DEBUG_OUT(fprintf(stderr, "**** %s\n ", *allocuserpwd));

      ntlm->state = NTLMSTATE_TYPE3; /* we send a type-3 */
      authp->done = TRUE;
    }
    break;

  case NTLMSTATE_TYPE3:
    /* connection is already authenticated,
     * don't send a header in future requests */
    ntlm->state = NTLMSTATE_LAST;
    /* fall-through */
  case NTLMSTATE_LAST:
    Curl_safefree(*allocuserpwd);
    authp->done = TRUE;
    break;
  }

  return CURLE_OK;
}